

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O2

int __thiscall MeCab::Param::open(Param *this,char *__file,int __oflag,...)

{
  string *this_00;
  Param *this_01;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  undefined8 uVar5;
  ostream *poVar6;
  undefined8 *in_RCX;
  size_t i;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  char *pcVar12;
  char cVar13;
  undefined8 *puVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  char *key;
  undefined8 *puVar18;
  allocator local_e1;
  int local_e0;
  int local_dc;
  Param *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  long local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e0 = (int)__file;
  if (local_e0 < 1) {
    uVar5 = std::__cxx11::string::assign((char *)&this->system_name_);
    iVar1 = (int)CONCAT71((int7)((ulong)uVar5 >> 8),1);
  }
  else {
    std::__cxx11::string::string((string *)&local_c0,(char *)*___oflag,(allocator *)&local_98);
    std::__cxx11::string::operator=((string *)&this->system_name_,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string
              ((string *)&local_70,
               "MeCab: Yet Another Part-of-Speech and Morphological Analyzer\n\nCopyright(C) 2001-2012 Taku Kudo \nCopyright(C) 2004-2008 Nippon Telegraph and Telephone Corporation\n"
               ,&local_e1);
    std::operator+(&local_50,&local_70,"\nUsage: ");
    std::operator+(&local_98,&local_50,&this->system_name_);
    std::operator+(&local_c0,&local_98," [options] files\n");
    this_00 = &this->help_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_70,"open_jtalk",&local_e1);
    std::operator+(&local_50,&local_70," of ");
    std::operator+(&local_98,&local_50,"1.11");
    std::operator+(&local_c0,&local_98,'\n');
    local_d8 = this;
    std::__cxx11::string::operator=((string *)&this->version_,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    uVar17 = 0;
    for (puVar11 = in_RCX; (char *)*puVar11 != (char *)0x0; puVar11 = puVar11 + 5) {
      sVar2 = strlen((char *)*puVar11);
      if ((char *)puVar11[3] == (char *)0x0) {
        uVar7 = sVar2 + 1;
      }
      else {
        sVar3 = strlen((char *)puVar11[3]);
        uVar7 = sVar2 + sVar3 + 2;
      }
      if (uVar17 < uVar7) {
        uVar17 = uVar7;
      }
    }
    lVar8 = 0;
    local_d0 = ___oflag;
    local_c8 = in_RCX;
    while( true ) {
      puVar11 = local_c8;
      cVar13 = (char)this_00;
      if ((char *)local_c8[lVar8 * 5] == (char *)0x0) break;
      sVar2 = strlen((char *)local_c8[lVar8 * 5]);
      if ((char *)puVar11[lVar8 * 5 + 3] != (char *)0x0) {
        sVar3 = strlen((char *)puVar11[lVar8 * 5 + 3]);
        sVar2 = sVar2 + sVar3 + 1;
      }
      std::__cxx11::string::append((char *)this_00);
      std::__cxx11::string::push_back(cVar13);
      std::__cxx11::string::append((char *)this_00);
      std::__cxx11::string::append((char *)this_00);
      if (puVar11[lVar8 * 5 + 3] != 0) {
        std::__cxx11::string::push_back(cVar13);
        std::__cxx11::string::append((char *)this_00);
      }
      for (; sVar2 <= uVar17; sVar2 = sVar2 + 1) {
        std::__cxx11::string::push_back(cVar13);
      }
      std::__cxx11::string::append((char *)this_00);
      std::__cxx11::string::push_back(cVar13);
      lVar8 = lVar8 + 1;
    }
    std::__cxx11::string::push_back(cVar13);
    this_01 = local_d8;
    for (puVar14 = puVar11 + 2; pcVar12 = (char *)puVar14[-2], pcVar12 != (char *)0x0;
        puVar14 = puVar14 + 5) {
      if ((char *)*puVar14 != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_c0,(char *)*puVar14,(allocator *)&local_98);
        set<std::__cxx11::string>(this_01,pcVar12,&local_c0,true);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
    pvVar4 = &this_01->rest_;
    local_dc = 1;
    puVar14 = local_d0;
    iVar15 = local_e0;
    local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar4;
    while( true ) {
      puVar10 = local_c8;
      puVar18 = local_d0;
      iVar16 = local_e0;
      pvVar4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71((int7)((ulong)pvVar4 >> 8),1);
      iVar1 = (int)pvVar4;
      if (iVar15 <= local_dc) break;
      lVar8 = (long)local_dc;
      pcVar12 = (char *)puVar14[lVar8];
      if (*pcVar12 == '-') {
        cVar13 = pcVar12[1];
        if (cVar13 != '\0') {
          local_a0 = lVar8;
          if (cVar13 == '-') {
            sVar2 = 0;
            for (pcVar9 = pcVar12 + 3; (cVar13 = pcVar9[-1], cVar13 != '\0' && (cVar13 != '='));
                pcVar9 = pcVar9 + 1) {
              sVar2 = sVar2 + 1;
            }
            puVar11 = local_c8;
            if (sVar2 == 0) {
              return iVar1;
            }
            while( true ) {
              key = (char *)*puVar11;
              if (key == (char *)0x0) goto LAB_0013cca9;
              sVar3 = strlen(key);
              if ((sVar3 == sVar2) &&
                 (iVar1 = strncmp(pcVar12 + 2,key,sVar2), puVar10 = local_c8, puVar18 = local_d0,
                 iVar16 = local_e0, iVar1 == 0)) break;
              puVar11 = puVar11 + 5;
            }
            if (puVar11[3] == 0) {
              if (cVar13 == '=') goto LAB_0013cd11;
LAB_0013cbfe:
              puVar11 = local_c8;
              puVar14 = local_d0;
              iVar15 = local_e0;
              local_c0._M_dataplus._M_p._0_4_ = 1;
              set<int>(local_d8,key,(int *)&local_c0,true);
              pvVar4 = extraout_RAX;
              goto LAB_0013cb2a;
            }
            if (cVar13 == '=') {
              std::__cxx11::string::string((string *)&local_c0,pcVar9,(allocator *)&local_98);
              iVar16 = local_e0;
              set<std::__cxx11::string>(local_d8,key,&local_c0,true);
            }
            else {
              iVar1 = local_dc + 1;
              if (iVar1 == local_e0) {
LAB_0013cd3e:
                puVar11 = local_d0;
                poVar6 = std::operator<<((ostream *)&local_d8->what_,"`");
                poVar6 = std::operator<<(poVar6,(char *)puVar11[local_a0]);
                pcVar12 = "` requires an argument";
                goto LAB_0013ccde;
              }
              local_dc = iVar1;
              std::__cxx11::string::string
                        ((string *)&local_c0,(char *)local_d0[iVar1],(allocator *)&local_98);
              set<std::__cxx11::string>(local_d8,key,&local_c0,true);
            }
          }
          else {
            do {
              puVar14 = puVar11;
              key = (char *)*puVar14;
              if (key == (char *)0x0) goto LAB_0013cca9;
              puVar11 = puVar14 + 5;
            } while (*(char *)(puVar14 + 1) != cVar13);
            if (puVar14[3] == 0) {
              if (pcVar12[2] == '\0') goto LAB_0013cbfe;
LAB_0013cd11:
              puVar11 = local_d0;
              poVar6 = std::operator<<((ostream *)&local_d8->what_,"`");
              poVar6 = std::operator<<(poVar6,(char *)puVar11[local_a0]);
              pcVar12 = "` doesn\'t allow an argument";
              goto LAB_0013ccde;
            }
            if (pcVar12[2] == '\0') {
              iVar1 = local_dc + 1;
              if (iVar1 == local_e0) goto LAB_0013cd3e;
              local_dc = iVar1;
              std::__cxx11::string::string
                        ((string *)&local_c0,(char *)local_d0[iVar1],(allocator *)&local_98);
              set<std::__cxx11::string>(local_d8,key,&local_c0,true);
            }
            else {
              std::__cxx11::string::string((string *)&local_c0,pcVar12 + 2,(allocator *)&local_98);
              set<std::__cxx11::string>(local_d8,key,&local_c0,true);
            }
          }
          goto LAB_0013cb22;
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_c0,pcVar12,(allocator *)&local_98);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_78,&local_c0);
        puVar10 = puVar11;
        puVar18 = puVar14;
        iVar16 = iVar15;
LAB_0013cb22:
        pvVar4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::__cxx11::string::~string((string *)&local_c0);
        puVar11 = puVar10;
        puVar14 = puVar18;
        iVar15 = iVar16;
      }
LAB_0013cb2a:
      local_dc = local_dc + 1;
    }
  }
  return iVar1;
LAB_0013cca9:
  poVar6 = std::operator<<((ostream *)&local_d8->what_,"unrecognized option `");
  poVar6 = std::operator<<(poVar6,(char *)local_d0[local_a0]);
  pcVar12 = "`";
LAB_0013ccde:
  std::operator<<(poVar6,pcVar12);
  return 0;
}

Assistant:

bool Param::open(int argc, char **argv, const Option *opts) {
  int ind = 0;
  int _errno = 0;

#define GOTO_ERROR(n) {                         \
    _errno = n;                                 \
    goto ERROR; } while (0)

  if (argc <= 0) {
    system_name_ = "unknown";
    return true;  // this is not error
  }

  system_name_ = std::string(argv[0]);

  init_param(&help_, &version_, system_name_, opts);

  for (size_t i = 0; opts[i].name; ++i) {
    if (opts[i].default_value) set<std::string>
                                   (opts[i].name, opts[i].default_value);
  }

  for (ind = 1; ind < argc; ind++) {
    if (argv[ind][0] == '-') {
      // long options
      if (argv[ind][1] == '-') {
        char *s;
        for (s = &argv[ind][2]; *s != '\0' && *s != '='; s++);
        size_t len = (size_t)(s - &argv[ind][2]);
        if (len == 0) return true;  // stop the scanning

        bool hit = false;
        size_t i = 0;
        for (i = 0; opts[i].name; ++i) {
          size_t nlen = std::strlen(opts[i].name);
          if (nlen == len && std::strncmp(&argv[ind][2],
                                          opts[i].name, len) == 0) {
            hit = true;
            break;
          }
        }

        if (!hit) GOTO_ERROR(0);

        if (opts[i].arg_description) {
          if (*s == '=') {
            set<std::string>(opts[i].name, s+1);
          } else {
            if (argc == (ind+1)) GOTO_ERROR(1);
            set<std::string>(opts[i].name, argv[++ind]);
          }
        } else {
          if (*s == '=') GOTO_ERROR(2);
          set<int>(opts[i].name, 1);
        }

        // short options
      } else if (argv[ind][1] != '\0') {
        size_t i = 0;
        bool hit = false;
        for (i = 0; opts[i].name; ++i) {
          if (opts[i].short_name == argv[ind][1]) {
            hit = true;
            break;
          }
        }

        if (!hit) GOTO_ERROR(0);

        if (opts[i].arg_description) {
          if (argv[ind][2] != '\0') {
            set<std::string>(opts[i].name, &argv[ind][2]);
          } else {
            if (argc == (ind+1)) GOTO_ERROR(1);
            set<std::string>(opts[i].name, argv[++ind]);
          }
        } else {
          if (argv[ind][2] != '\0') GOTO_ERROR(2);
          set<int>(opts[i].name, 1);
        }
      }
    } else {
      rest_.push_back(std::string(argv[ind]));  // others
    }
  }

  return true;

ERROR:
  switch (_errno) {
    case 0: WHAT << "unrecognized option `" << argv[ind] << "`"; break;
    case 1: WHAT << "`" << argv[ind] << "` requires an argument";  break;
    case 2: WHAT << "`" << argv[ind] << "` doesn't allow an argument"; break;
  }
  return false;
}